

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmMakefile *makefile,
                   cmGeneratorExpressionContext *context,cmTarget *headTarget,
                   cmTarget *currentTarget,cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  cmCompiledGeneratorExpression *pcVar2;
  char *pcVar3;
  allocator local_66;
  undefined1 local_65;
  cmGeneratorExpression local_58;
  cmCompiledGeneratorExpression *local_50;
  auto_ptr<cmCompiledGeneratorExpression> local_48;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmTarget *currentTarget_local;
  cmTarget *headTarget_local;
  cmGeneratorExpressionContext *context_local;
  cmMakefile *makefile_local;
  string *prop_local;
  string *result;
  
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&cge,&context->Backtrace);
  cmGeneratorExpression::Parse(&local_58,(string *)&cge);
  local_50 = (cmCompiledGeneratorExpression *)
             cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_58);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_48,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_50);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_58);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_48);
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem
            (pcVar2,(bool)(context->EvaluateForBuildsystem & 1));
  local_65 = 0;
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_48);
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,makefile,&context->Config,(bool)(context->Quiet & 1),headTarget,
                      currentTarget,dagChecker,&context->Language);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_66);
  std::allocator<char>::~allocator((allocator<char> *)&local_66);
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_48);
  bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadContextSensitiveCondition = true;
  }
  pcVar2 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_48);
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  if (bVar1) {
    context->HadHeadSensitiveCondition = true;
  }
  local_65 = 1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_48);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
    std::string const& prop, cmMakefile *makefile,
    cmGeneratorExpressionContext *context,
    cmTarget const* headTarget, cmTarget const* currentTarget,
    cmGeneratorExpressionDAGChecker *dagChecker)
{
  cmGeneratorExpression ge(&context->Backtrace);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  std::string result = cge->Evaluate(makefile,
                        context->Config,
                        context->Quiet,
                        headTarget,
                        currentTarget,
                        dagChecker,
                        context->Language);
  if (cge->GetHadContextSensitiveCondition())
    {
    context->HadContextSensitiveCondition = true;
    }
  if (cge->GetHadHeadSensitiveCondition())
    {
    context->HadHeadSensitiveCondition = true;
    }
  return result;
}